

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_context_enumerate_devices__pulse
                    (ma_context *pContext,ma_enum_devices_callback_proc callback,void *pUserData)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ma_result mVar7;
  ma_context_enumerate_devices_callback_data__pulse callbackData;
  ma_context *local_50;
  ma_enum_devices_callback_proc local_48;
  void *local_40;
  int local_38;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4a9d,
                  "ma_result ma_context_enumerate_devices__pulse(ma_context *, ma_enum_devices_callback_proc, void *)"
                 );
  }
  if (callback == (ma_enum_devices_callback_proc)0x0) {
    __assert_fail("callback != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4a9e,
                  "ma_result ma_context_enumerate_devices__pulse(ma_context *, ma_enum_devices_callback_proc, void *)"
                 );
  }
  local_38 = 0;
  local_50 = pContext;
  local_48 = callback;
  local_40 = pUserData;
  lVar4 = (*(pContext->field_21).alsa.snd_pcm_open)();
  mVar7 = -300;
  if (lVar4 != 0) {
    lVar5 = (*(pContext->field_21).alsa.snd_pcm_hw_params_sizeof)(lVar4);
    if ((lVar5 != 0) &&
       (lVar5 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_format_first)
                          (lVar5,(pContext->field_21).alsa.snd_pcm_mmap_commit), lVar5 != 0)) {
      uVar1 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_channels_near)
                        (lVar5,(pContext->field_21).alsa.snd_pcm_recover,
                         (ulong)((pContext->field_21).pulse.tryAutoSpawn == 0),0);
      if (uVar1 != 0) {
        (*(pContext->field_21).alsa.snd_pcm_hw_params_get_format_mask)(lVar5);
        (*(pContext->field_21).alsa.snd_pcm_close)(lVar4);
        if (5 < uVar1) {
          return -1;
        }
        return *(ma_result *)(&DAT_00115fe0 + (long)(int)uVar1 * 4);
      }
      uVar1 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near)(lVar5);
      while (uVar1 != 4) {
        if (uVar1 - 1 < 3) {
          iVar2 = (*(pContext->field_21).alsa.snd_pcm_hw_params_any)(lVar4,1,0);
          if (iVar2 < 0) {
            mVar7 = -1;
            goto LAB_0010cccd;
          }
        }
        else if ((uVar1 < 7) && ((0x61U >> (uVar1 & 0x1f) & 1) != 0)) {
          mVar7 = 0;
          goto LAB_0010cccd;
        }
        uVar1 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near)(lVar5);
      }
      lVar6 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_periods_near)
                        (lVar5,ma_context_enumerate_devices_sink_callback__pulse,&local_50);
      mVar7 = -1;
      if (lVar6 != 0) {
        mVar7 = 0;
        do {
          iVar2 = (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_max)(lVar6);
          if (iVar2 != 0) goto LAB_0010cc56;
          iVar3 = (*(pContext->field_21).alsa.snd_pcm_hw_params_any)(lVar4,1,0);
        } while (-1 < iVar3);
        mVar7 = -1;
LAB_0010cc56:
        (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_min)(lVar6);
        if ((iVar2 != 0) && (local_38 == 0)) {
          lVar6 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_access)
                            (lVar5,ma_context_enumerate_devices_source_callback__pulse,&local_50);
          mVar7 = -1;
          if (lVar6 != 0) {
            mVar7 = 0;
            do {
              iVar2 = (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_max)(lVar6);
              if (iVar2 != 0) goto LAB_0010ccb7;
              iVar2 = (*(pContext->field_21).alsa.snd_pcm_hw_params_any)(lVar4,1,0);
            } while (-1 < iVar2);
            mVar7 = -1;
LAB_0010ccb7:
            (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_min)(lVar6);
          }
        }
      }
LAB_0010cccd:
      (*(pContext->field_21).alsa.snd_pcm_hw_params_set_rate_resample)(lVar5);
      (*(pContext->field_21).alsa.snd_pcm_hw_params_get_format_mask)(lVar5);
    }
    (*(pContext->field_21).alsa.snd_pcm_close)(lVar4);
  }
  return mVar7;
}

Assistant:

static ma_result ma_context_enumerate_devices__pulse(ma_context* pContext, ma_enum_devices_callback_proc callback, void* pUserData)
{
    ma_result result = MA_SUCCESS;
    ma_context_enumerate_devices_callback_data__pulse callbackData;
    ma_pa_operation* pOP = NULL;
    ma_pa_mainloop* pMainLoop;
    ma_pa_mainloop_api* pAPI;
    ma_pa_context* pPulseContext;
    int error;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(callback != NULL);

    callbackData.pContext = pContext;
    callbackData.callback = callback;
    callbackData.pUserData = pUserData;
    callbackData.isTerminated = MA_FALSE;

    pMainLoop = ((ma_pa_mainloop_new_proc)pContext->pulse.pa_mainloop_new)();
    if (pMainLoop == NULL) {
        return MA_FAILED_TO_INIT_BACKEND;
    }

    pAPI = ((ma_pa_mainloop_get_api_proc)pContext->pulse.pa_mainloop_get_api)(pMainLoop);
    if (pAPI == NULL) {
        ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
        return MA_FAILED_TO_INIT_BACKEND;
    }

    pPulseContext = ((ma_pa_context_new_proc)pContext->pulse.pa_context_new)(pAPI, pContext->pulse.pApplicationName);
    if (pPulseContext == NULL) {
        ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
        return MA_FAILED_TO_INIT_BACKEND;
    }

    error = ((ma_pa_context_connect_proc)pContext->pulse.pa_context_connect)(pPulseContext, pContext->pulse.pServerName, (pContext->pulse.tryAutoSpawn) ? 0 : MA_PA_CONTEXT_NOAUTOSPAWN, NULL);
    if (error != MA_PA_OK) {
        ((ma_pa_context_unref_proc)pContext->pulse.pa_context_unref)(pPulseContext);
        ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
        return ma_result_from_pulse(error);
    }

    for (;;) {
        ma_pa_context_state_t state = ((ma_pa_context_get_state_proc)pContext->pulse.pa_context_get_state)(pPulseContext);
        if (state == MA_PA_CONTEXT_READY) {
            break;  /* Success. */
        }
        if (state == MA_PA_CONTEXT_CONNECTING || state == MA_PA_CONTEXT_AUTHORIZING || state == MA_PA_CONTEXT_SETTING_NAME) {
            error = ((ma_pa_mainloop_iterate_proc)pContext->pulse.pa_mainloop_iterate)(pMainLoop, 1, NULL);
            if (error < 0) {
                result = ma_result_from_pulse(error);
                goto done;
            }

#ifdef MA_DEBUG_OUTPUT
            printf("[PulseAudio] pa_context_get_state() returned %d. Waiting.\n", state);
#endif
            continue;   /* Keep trying. */
        }
        if (state == MA_PA_CONTEXT_UNCONNECTED || state == MA_PA_CONTEXT_FAILED || state == MA_PA_CONTEXT_TERMINATED) {
#ifdef MA_DEBUG_OUTPUT
            printf("[PulseAudio] pa_context_get_state() returned %d. Failed.\n", state);
#endif
            goto done;  /* Failed. */
        }
    }


    /* Playback. */
    if (!callbackData.isTerminated) {
        pOP = ((ma_pa_context_get_sink_info_list_proc)pContext->pulse.pa_context_get_sink_info_list)(pPulseContext, ma_context_enumerate_devices_sink_callback__pulse, &callbackData);
        if (pOP == NULL) {
            result = MA_ERROR;
            goto done;
        }

        result = ma_wait_for_operation__pulse(pContext, pMainLoop, pOP);
        ((ma_pa_operation_unref_proc)pContext->pulse.pa_operation_unref)(pOP);
        if (result != MA_SUCCESS) {
            goto done;
        }
    }


    /* Capture. */
    if (!callbackData.isTerminated) {
        pOP = ((ma_pa_context_get_source_info_list_proc)pContext->pulse.pa_context_get_source_info_list)(pPulseContext, ma_context_enumerate_devices_source_callback__pulse, &callbackData);
        if (pOP == NULL) {
            result = MA_ERROR;
            goto done;
        }

        result = ma_wait_for_operation__pulse(pContext, pMainLoop, pOP);
        ((ma_pa_operation_unref_proc)pContext->pulse.pa_operation_unref)(pOP);
        if (result != MA_SUCCESS) {
            goto done;
        }
    }

done:
    ((ma_pa_context_disconnect_proc)pContext->pulse.pa_context_disconnect)(pPulseContext);
    ((ma_pa_context_unref_proc)pContext->pulse.pa_context_unref)(pPulseContext);
    ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
    return result;
}